

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O1

int getColorForTemp(string *temp,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *recoveredGraph,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *tempToColorMap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type *__v;
  _Base_ptr p_Var6;
  int iVar7;
  _Rb_tree_header *p_Var8;
  string neighbour;
  set<int,_std::less<int>,_std::allocator<int>_> colorSet;
  key_type local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](recoveredGraph,temp);
  p_Var6 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(p_Var6 + 1),
                 (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&tempToColorMap->_M_t,&local_80);
      if ((_Rb_tree_header *)iVar5._M_node == &(tempToColorMap->_M_t)._M_impl.super__Rb_tree_header)
      {
        __assert_fail("tempToColorMap.find(neighbour) != tempToColorMap.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/register_allocation/RegisterAllocation.cpp"
                      ,0x6e,
                      "int getColorForTemp(const std::string &, std::map<std::string, std::set<std::string>> &, std::map<std::string, int> &)"
                     );
      }
      __v = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](tempToColorMap,&local_80);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,__v);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  p_Var6 = &p_Var1->_M_header;
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
  iVar3 = 0;
  do {
    for (; iVar7 = iVar3, (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < iVar7]) {
      if (iVar7 <= (int)*(size_t *)(p_Var2 + 1)) {
        p_Var6 = p_Var2;
      }
      iVar3 = iVar7;
    }
    p_Var8 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var8 = (_Rb_tree_header *)p_Var6, iVar7 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)
       ) {
      p_Var8 = p_Var1;
    }
    p_Var6 = &p_Var1->_M_header;
    p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    iVar3 = iVar7 + 1;
  } while (p_Var8 != p_Var1);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return iVar7;
}

Assistant:

int getColorForTemp(const std::string& temp,
                    std::map<std::string, std::set<std::string>>& recoveredGraph,
                    std::map<std::string, int>& tempToColorMap) {

    std::set<int> colorSet;
    for (std::string neighbour : recoveredGraph[temp]) {
        assert(tempToColorMap.find(neighbour) != tempToColorMap.end());
        colorSet.insert(tempToColorMap[neighbour]);
    }

    int color = 0;
    while (colorSet.find(color) != colorSet.end()) {
        ++color;
    }

    return color;
}